

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Substitution
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  bool bVar1;
  TPZFMatrix<std::complex<long_double>_> *pTVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  long lVar5;
  long lVar6;
  TPZMatrix<std::complex<long_double>_> *pTVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r_1;
  complex<long_double> __r;
  undefined4 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  undefined2 uVar15;
  unkbyte10 Var16;
  unkbyte10 Var17;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined4 uStack_11c;
  long local_118;
  int64_t local_110;
  TPZMatrix<std::complex<long_double>_> *local_108;
  TPZFMatrix<std::complex<long_double>_> *local_100;
  complex<long_double> local_f8;
  long local_d8;
  long local_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  longdouble local_a4;
  undefined8 local_98 [4];
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  local_118 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  local_110 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  local_108 = this;
  local_100 = B;
  if (local_118 != (this->super_TPZBaseMatrix).fRow) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  pTVar2 = local_100;
  if (0 < local_118) {
    lVar3 = 0;
    do {
      if (0 < local_110) {
        lVar4 = 0;
        do {
          if (lVar3 != 0) {
            lVar6 = 0;
            pTVar7 = local_108;
            do {
              (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_c8,pTVar2,lVar3,lVar4);
              (*(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_98,pTVar7,lVar3,lVar6);
              (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,pTVar2,lVar6,lVar4);
              pTVar7 = local_108;
              local_f8._M_value._16_8_ = local_98[2];
              local_f8._M_value._24_2_ = SUB82(local_98[3],0);
              local_f8._M_value._26_6_ = SUB86((ulong)local_98[3] >> 0x10,0);
              local_f8._M_value._0_8_ = local_98[0];
              local_f8._M_value._8_2_ = SUB82(local_98[1],0);
              local_f8._M_value._10_6_ = SUB86((ulong)local_98[1] >> 0x10,0);
              std::complex<long_double>::operator*=(&local_f8,&local_58);
              uStack_130 = (undefined2)uStack_c0;
              uStack_12e = (undefined2)((uint)uStack_c0 >> 0x10);
              uStack_12c = uStack_bc;
              uStack_120 = (undefined2)uStack_b0;
              uStack_11e = (undefined2)((uint)uStack_b0 >> 0x10);
              uStack_11c = uStack_ac;
              lVar10 = (longdouble)CONCAT28(uStack_130,CONCAT44(uStack_c4,local_c8)) -
                       (longdouble)CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_);
              lVar8 = (longdouble)CONCAT28(uStack_120,CONCAT44(uStack_b4,local_b8)) -
                      (longdouble)CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_);
              local_138 = SUB104(lVar10,0);
              uStack_134 = (undefined4)((unkuint10)lVar10 >> 0x20);
              uStack_130 = (undefined2)((unkuint10)lVar10 >> 0x40);
              local_128 = SUB104(lVar8,0);
              uStack_124 = (undefined4)((unkuint10)lVar8 >> 0x20);
              uStack_120 = (undefined2)((unkuint10)lVar8 >> 0x40);
              (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x23])(pTVar2,lVar3,lVar4,&local_138);
              lVar6 = lVar6 + 1;
            } while (lVar3 != lVar6);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != local_110);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != local_118);
  }
  if (0 < local_110) {
    lVar3 = 0;
    local_a4 = (longdouble)1e-16;
    do {
      if (0 < local_118) {
        local_d0 = 0;
        local_d8 = local_118;
        do {
          lVar4 = local_d8 + -1;
          lVar8 = in_ST1;
          lVar10 = in_ST2;
          if (local_d8 < local_118) {
            lVar6 = 0;
            do {
              pTVar2 = local_100;
              lVar5 = local_d8 + lVar6;
              (*(local_100->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_c8,local_100,lVar4,lVar3);
              (*(local_108->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_98,local_108,lVar4,lVar5);
              (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,pTVar2,lVar5,lVar3);
              local_f8._M_value._16_8_ = local_98[2];
              local_f8._M_value._24_2_ = SUB82(local_98[3],0);
              local_f8._M_value._26_6_ = SUB86((ulong)local_98[3] >> 0x10,0);
              local_f8._M_value._0_8_ = local_98[0];
              local_f8._M_value._8_2_ = SUB82(local_98[1],0);
              local_f8._M_value._10_6_ = SUB86((ulong)local_98[1] >> 0x10,0);
              std::complex<long_double>::operator*=(&local_f8,&local_58);
              uStack_130 = (undefined2)uStack_c0;
              uStack_12e = (undefined2)((uint)uStack_c0 >> 0x10);
              uStack_12c = uStack_bc;
              uStack_120 = (undefined2)uStack_b0;
              uStack_11e = (undefined2)((uint)uStack_b0 >> 0x10);
              uStack_11c = uStack_ac;
              lVar11 = (longdouble)CONCAT28(uStack_130,CONCAT44(uStack_c4,local_c8)) -
                       (longdouble)CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_);
              lVar9 = (longdouble)CONCAT28(uStack_120,CONCAT44(uStack_b4,local_b8)) -
                      (longdouble)CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_);
              local_138 = SUB104(lVar11,0);
              uStack_134 = (undefined4)((unkuint10)lVar11 >> 0x20);
              uStack_130 = (undefined2)((unkuint10)lVar11 >> 0x40);
              local_128 = SUB104(lVar9,0);
              uStack_124 = (undefined4)((unkuint10)lVar9 >> 0x20);
              uStack_120 = (undefined2)((unkuint10)lVar9 >> 0x40);
              (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x23])(pTVar2,lVar4,lVar3,&local_138);
              lVar6 = lVar6 + 1;
            } while (local_d0 != lVar6);
          }
          in_ST1 = in_ST4;
          pTVar7 = local_108;
          (*(local_108->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_78,local_108,lVar4,lVar4);
          local_138 = (undefined4)local_78._0_10_;
          uStack_134 = SUB104(local_78._0_10_,4);
          uStack_130 = SUB102(local_78._0_10_,8);
          local_128 = (undefined4)local_78._16_10_;
          uStack_124 = SUB104(local_78._16_10_,4);
          uStack_120 = SUB102(local_78._16_10_,8);
          uVar12 = local_138;
          uVar13 = uStack_130;
          uVar14 = local_128;
          uVar15 = uStack_120;
          cabsl();
          lVar9 = ABS(in_ST0);
          in_ST0 = in_ST3;
          if (lVar9 < local_a4) {
            Error("BackSub( SubstitutionLU ) <Matrix is singular",(char *)0x0);
            in_ST0 = in_ST3;
          }
          pTVar2 = local_100;
          (*(local_100->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_c8,local_100,lVar4,lVar3,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15);
          (*(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_f8,pTVar7,lVar4,lVar4);
          local_138 = local_c8;
          uStack_134 = uStack_c4;
          uStack_130 = (undefined2)uStack_c0;
          uStack_12e = (undefined2)((uint)uStack_c0 >> 0x10);
          uStack_12c = uStack_bc;
          local_128 = local_b8;
          uStack_124 = uStack_b4;
          uStack_120 = (undefined2)uStack_b0;
          uStack_11e = (undefined2)((uint)uStack_b0 >> 0x10);
          uStack_11c = uStack_ac;
          Var16 = CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_);
          Var17 = CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_);
          in_ST2 = in_ST1;
          in_ST3 = in_ST1;
          in_ST4 = in_ST1;
          uVar12 = local_c8;
          uVar13 = uStack_130;
          uVar14 = local_b8;
          uVar15 = uStack_120;
          __divxc3();
          local_138 = SUB104(lVar8,0);
          uStack_134 = (undefined4)((unkuint10)lVar8 >> 0x20);
          uStack_130 = (undefined2)((unkuint10)lVar8 >> 0x40);
          local_128 = SUB104(lVar10,0);
          uStack_124 = (undefined4)((unkuint10)lVar10 >> 0x20);
          uStack_120 = (undefined2)((unkuint10)lVar10 >> 0x40);
          (*(pTVar2->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x23])
                    (pTVar2,lVar4,lVar3,&local_138,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15,Var16,
                     Var17);
          local_d0 = local_d0 + 1;
          bVar1 = 1 < local_d8;
          local_d8 = lVar4;
        } while (bVar1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != local_110);
  }
  return 1;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}